

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall chaiscript::parser::ChaiScript_Parser::For_Guards(ChaiScript_Parser *this)

{
  bool bVar1;
  undefined8 uVar2;
  File_Position *t_where;
  vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
  *this_00;
  long in_RDI;
  value_type *in_stack_fffffffffffffef8;
  ChaiScript_Parser *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff18;
  File_Position *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  string *t_why;
  eval_error *in_stack_ffffffffffffff30;
  File_Position local_84;
  string local_78 [8];
  ChaiScript_Parser *in_stack_ffffffffffffff90;
  File_Position local_44 [3];
  allocator local_29;
  string local_28 [40];
  
  bVar1 = Equation(in_stack_ffffffffffffff90);
  if ((!bVar1) || (bVar1 = Eol(in_stack_ffffffffffffff00), !bVar1)) {
    bVar1 = Eol(in_stack_ffffffffffffff00);
    if (!bVar1) {
      uVar2 = __cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_28,"\'for\' loop initial statment missing",&local_29);
      File_Position::File_Position(local_44,*(int *)(in_RDI + 0xcb8),*(int *)(in_RDI + 0xcbc));
      std::
      __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_ffffffffffffff00);
      exception::eval_error::eval_error
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff18);
      __cxa_throw(uVar2,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    in_stack_ffffffffffffff30 = (eval_error *)(in_RDI + 0x70);
    make_shared<chaiscript::AST_Node,chaiscript::eval::Noop_AST_Node>();
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::push_back((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                 *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::shared_ptr<chaiscript::AST_Node>::~shared_ptr((shared_ptr<chaiscript::AST_Node> *)0x26e7ac)
    ;
  }
  bVar1 = Equation(in_stack_ffffffffffffff90);
  if ((!bVar1) || (bVar1 = Eol(in_stack_ffffffffffffff00), !bVar1)) {
    bVar1 = Eol(in_stack_ffffffffffffff00);
    if (!bVar1) {
      t_where = (File_Position *)__cxa_allocate_exception(0x90);
      t_why = (string *)&stack0xffffffffffffff87;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"\'for\' loop condition missing",(allocator *)t_why);
      File_Position::File_Position(&local_84,*(int *)(in_RDI + 0xcb8),*(int *)(in_RDI + 0xcbc));
      std::
      __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)in_stack_ffffffffffffff00);
      exception::eval_error::eval_error
                (in_stack_ffffffffffffff30,t_why,t_where,in_stack_ffffffffffffff18);
      __cxa_throw(t_where,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    make_shared<chaiscript::AST_Node,chaiscript::eval::Noop_AST_Node>();
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::push_back((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                 *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::shared_ptr<chaiscript::AST_Node>::~shared_ptr((shared_ptr<chaiscript::AST_Node> *)0x26e955)
    ;
  }
  bVar1 = Equation(in_stack_ffffffffffffff90);
  if (!bVar1) {
    this_00 = (vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
               *)(in_RDI + 0x70);
    make_shared<chaiscript::AST_Node,chaiscript::eval::Noop_AST_Node>();
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::push_back(this_00,in_stack_fffffffffffffef8);
    std::shared_ptr<chaiscript::AST_Node>::~shared_ptr((shared_ptr<chaiscript::AST_Node> *)0x26e9bf)
    ;
  }
  return true;
}

Assistant:

bool For_Guards() {
        if (!(Equation() && Eol()))
        {
          if (!Eol())
          {
            throw exception::eval_error("'for' loop initial statment missing", File_Position(m_position.line, m_position.col), *m_filename);
          } else {
            m_match_stack.push_back(chaiscript::make_shared<AST_Node, eval::Noop_AST_Node>());
          }
        }

        if (!(Equation() && Eol()))
        {
          if (!Eol())
          {
            throw exception::eval_error("'for' loop condition missing", File_Position(m_position.line, m_position.col), *m_filename);
          } else {
            m_match_stack.push_back(chaiscript::make_shared<AST_Node, eval::Noop_AST_Node>());
          }
        }

        if (!Equation())
        {
          m_match_stack.push_back(chaiscript::make_shared<AST_Node, eval::Noop_AST_Node>());
        }

        return true; 
      }